

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

bool BattleWithLandlord::GenCarry
               (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *count
               ,uint len,int carry,
               vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
               *res)

{
  uint uVar1;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *p_Var2;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *p_Var3;
  iterator iVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var8
  ;
  ulong uVar9;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *this;
  vector<char,_std::allocator<char>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vi;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  void *local_b8;
  char *pcStack_b0;
  char *local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  iterator iStack_90;
  uint *local_88;
  ulong local_78;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  *local_70;
  uint local_68 [2];
  undefined4 local_60 [2];
  undefined8 local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined8 local_40;
  ulong local_38;
  
  uVar9 = (ulong)len;
  p_Var2 = &((res->
             super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var3 = &((res->
             super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this = p_Var2;
  local_70 = res;
  if (p_Var3 != p_Var2) {
    do {
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(this);
      this = this + 1;
    } while (this != p_Var3);
    (local_70->
    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  }
  if (carry == 1) {
    local_b8 = (void *)0x0;
    pcStack_b0 = (char *)0x0;
    local_a8 = (char *)0x0;
    for (p_Var6 = (count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(count->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (*(int *)&p_Var6[1].field_0x4 != 0) {
        if (pcStack_b0 == local_a8) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_b8,(iterator)pcStack_b0,
                     (char *)(p_Var6 + 1));
        }
        else {
          *pcStack_b0 = (char)p_Var6[1]._M_color;
          pcStack_b0 = pcStack_b0 + 1;
        }
      }
    }
    uVar7 = (long)pcStack_b0 - (long)local_b8;
    if (uVar9 <= uVar7) {
      local_98._M_current = (uint *)0x0;
      iStack_90._M_current = (uint *)0x0;
      local_88 = (uint *)0x0;
      local_68[0] = 0;
      if (len != 0) {
        do {
          if (iStack_90._M_current == local_88) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,iStack_90,
                       local_68);
          }
          else {
            *iStack_90._M_current = local_68[0];
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          local_68[0] = local_68[0] + 1;
        } while (local_68[0] < len);
      }
      local_78 = uVar9;
      do {
        iVar4._M_current = iStack_90._M_current;
        local_60[0] = 0;
        local_58 = 0;
        local_40 = 0;
        local_50 = local_60;
        local_48 = local_60;
        for (_Var8._M_current = local_98._M_current; _Var8._M_current != iVar4._M_current;
            _Var8._M_current = _Var8._M_current + 1) {
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)local_68,(char *)((ulong)*_Var8._M_current + (long)local_b8));
        }
        std::
        vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ::push_back(local_70,(value_type *)local_68);
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   *)local_68);
        bVar5 = next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                          (local_98,(long)iStack_90._M_current - (long)local_98._M_current >> 2,
                           (long)pcStack_b0 - (long)local_b8);
      } while (bVar5);
      uVar9 = local_78;
      if (local_98._M_current != (uint *)0x0) {
        operator_delete(local_98._M_current);
        uVar9 = local_78;
      }
    }
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8);
    }
    if (uVar7 < uVar9) {
      return false;
    }
  }
  else if (carry == 2) {
    local_b8 = (void *)0x0;
    pcStack_b0 = (char *)0x0;
    local_a8 = (char *)0x0;
    for (p_Var6 = (count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(count->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (1 < *(int *)&p_Var6[1].field_0x4) {
        if (pcStack_b0 == local_a8) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_b8,(iterator)pcStack_b0,
                     (char *)(p_Var6 + 1));
        }
        else {
          *pcStack_b0 = (char)p_Var6[1]._M_color;
          pcStack_b0 = pcStack_b0 + 1;
        }
      }
    }
    uVar7 = (long)pcStack_b0 - (long)local_b8;
    if (uVar9 <= uVar7) {
      local_98._M_current = (uint *)0x0;
      iStack_90._M_current = (uint *)0x0;
      local_88 = (uint *)0x0;
      local_68[0] = 0;
      if (len != 0) {
        do {
          if (iStack_90._M_current == local_88) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,iStack_90,
                       local_68);
          }
          else {
            *iStack_90._M_current = local_68[0];
            iStack_90._M_current = iStack_90._M_current + 1;
          }
          local_68[0] = local_68[0] + 1;
        } while (local_68[0] < len);
      }
      local_78 = uVar7;
      local_38 = uVar9;
      do {
        iVar4._M_current = iStack_90._M_current;
        local_60[0] = 0;
        local_58 = 0;
        local_40 = 0;
        local_50 = local_60;
        local_48 = local_60;
        for (_Var8._M_current = local_98._M_current; _Var8._M_current != iVar4._M_current;
            _Var8._M_current = _Var8._M_current + 1) {
          uVar1 = *_Var8._M_current;
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)local_68,(char *)((long)local_b8 + (ulong)uVar1));
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)local_68,(char *)((ulong)uVar1 + (long)local_b8));
        }
        std::
        vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ::push_back(local_70,(value_type *)local_68);
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   *)local_68);
        bVar5 = next_combination<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                          (local_98,(long)iStack_90._M_current - (long)local_98._M_current >> 2,
                           (long)pcStack_b0 - (long)local_b8);
      } while (bVar5);
      uVar7 = local_78;
      uVar9 = local_38;
      if (local_98._M_current != (uint *)0x0) {
        operator_delete(local_98._M_current);
        uVar7 = local_78;
        uVar9 = local_38;
      }
    }
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8);
    }
    if (uVar7 < uVar9) {
      return false;
    }
  }
  return true;
}

Assistant:

bool BattleWithLandlord::GenCarry(const map<byte, int> &count, unsigned len, int carry, vector<multiset<byte> > &res) {
    res.clear();
    if (carry == 2) {
        vector<byte> v;
        for (auto &x: count) {
            if (x.second > 1) {
                v.push_back(x.first);
            }
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while (next_combination(vi.begin(),vi.size(),v.size()));
    } else if (carry == 1) {
        vector<byte> v;
        for (auto &x: count) {
#ifdef DIFF_CARRY
            if (x.second)
                v.push_back(x.first);
#else
            for (int i = 0; i < x.second; ++i) {
                v.push_back(x.first);
            }
#endif
        }
        if (v.size() < len) return false;
        vector<unsigned> vi;
        for (unsigned i = 0; i < len; ++i) {
            vi.push_back(i);
        }
        do {
            multiset<byte> ms;
            for (auto x: vi) {
                ms.insert(v[x]);
            }
            res.push_back(ms);
        } while(next_combination(vi.begin(),vi.size(),v.size()));
        // bug remain, need to drop repeated items
        // fix it later
        // this is the reason why stl do not contain next_combination
    }
    return true;
}